

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O3

ze_result_t __thiscall
loader::context_t::init_driver
          (context_t *this,driver_t *driver,ze_init_flags_t flags,ze_init_driver_type_desc_t *desc,
          ze_global_dditable_t *globalInitStored,zes_global_dditable_t *sysmanGlobalInitStored,
          bool sysmanOnly)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ze_result_t zVar3;
  long lVar4;
  uint uVar5;
  ze_result_t zVar6;
  code *pcVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  ulong *puVar12;
  ze_result_t result;
  ze_result_t result_00;
  ze_result_t result_01;
  ze_result_t result_02;
  ze_result_t result_03;
  ze_result_t result_04;
  ze_result_t result_05;
  ze_result_t result_06;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  zes_global_dditable_t global;
  long *local_2d8;
  long local_2c8;
  long lStack_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  uint32_t local_238;
  undefined4 uStack_234;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (sysmanOnly) {
    pcVar7 = (code *)dlsym(driver->handle,"zesGetGlobalProcAddrTable");
    if (pcVar7 == (code *)0x0) {
      if (this->debugTraceEnabled != true) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      std::operator+(&local_2b8,"init driver ",&driver->name);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
      local_2d8 = &local_2c8;
      plVar8 = puVar9 + 2;
      if ((long *)*puVar9 == plVar8) {
        local_2c8 = *plVar8;
        lStack_2c0 = puVar9[3];
      }
      else {
        local_2c8 = *plVar8;
        local_2d8 = (long *)*puVar9;
      }
      lVar4 = puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,local_2d8,lVar4 + (long)local_2d8);
      to_string_abi_cxx11_(&local_50,(loader *)0x78000001,result_01);
      debug_trace_message(this,&local_150,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_1d0.field_2._M_allocated_capacity = local_150.field_2._M_allocated_capacity;
      _Var14._M_p = local_150._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) goto LAB_0018047d;
      goto LAB_00180485;
    }
    uVar5 = (*pcVar7)(0x1000d,&local_238);
    if (uVar5 == 0) {
      if (CONCAT44(uStack_234,local_238) == 0) {
        if (this->debugTraceEnabled != true) {
          return ZE_RESULT_ERROR_UNINITIALIZED;
        }
        std::operator+(&local_2b8,"init driver ",&driver->name);
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
        local_2d8 = &local_2c8;
        plVar8 = puVar9 + 2;
        if ((long *)*puVar9 == plVar8) {
          local_2c8 = *plVar8;
          lStack_2c0 = puVar9[3];
        }
        else {
          local_2c8 = *plVar8;
          local_2d8 = (long *)*puVar9;
        }
        lVar4 = puVar9[1];
        *puVar9 = plVar8;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,local_2d8,lVar4 + (long)local_2d8);
        to_string_abi_cxx11_(&local_90,(loader *)0x78000001,result_04);
        debug_trace_message(this,&local_190,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        local_1d0.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
        _Var14._M_p = local_190._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) goto LAB_0018047d;
        goto LAB_00180485;
      }
      zVar6 = (*sysmanGlobalInitStored->pfnInit)(flags);
      if (driver->initSysManStatus != ZE_RESULT_SUCCESS) {
        zVar6 = driver->initSysManStatus;
      }
      if (this->debugTraceEnabled != true) {
        return zVar6;
      }
      std::operator+(&local_258,"init driver ",&driver->name);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_258);
      paVar2 = &local_298.field_2;
      puVar12 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_298.field_2._M_allocated_capacity = *puVar12;
        local_298.field_2._8_8_ = plVar8[3];
        local_298._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *puVar12;
        local_298._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_298._M_string_length = plVar8[1];
      *plVar8 = (long)puVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      to_string_abi_cxx11_
                (&local_278,(loader *)(ulong)flags,(ze_init_flags_t)local_298._M_string_length);
      uVar1 = (long)(ze_structure_type_t *)local_298._M_string_length + local_278._M_string_length;
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar2) {
        uVar13 = local_298.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < uVar1) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          uVar13 = local_278.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < uVar1) goto LAB_00180166;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_278,0,(char *)0x0,(ulong)local_298._M_dataplus._M_p);
      }
      else {
LAB_00180166:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_298,(ulong)local_278._M_dataplus._M_p);
      }
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      psVar11 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2b8.field_2._M_allocated_capacity = *psVar11;
        local_2b8.field_2._8_8_ = puVar9[3];
      }
      else {
        local_2b8.field_2._M_allocated_capacity = *psVar11;
        local_2b8._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_2b8._M_string_length = puVar9[1];
      *puVar9 = psVar11;
      puVar9[1] = 0;
      *(undefined1 *)psVar11 = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
      local_2d8 = &local_2c8;
      plVar8 = puVar9 + 2;
      if ((long *)*puVar9 == plVar8) {
        local_2c8 = *plVar8;
        lStack_2c0 = puVar9[3];
      }
      else {
        local_2c8 = *plVar8;
        local_2d8 = (long *)*puVar9;
      }
      lVar4 = puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,local_2d8,lVar4 + (long)local_2d8);
      to_string_abi_cxx11_(&local_b0,(loader *)(ulong)zVar6,result_03);
      debug_trace_message(this,&local_1b0,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      _Var14._M_p = local_1b0._M_dataplus._M_p;
      zVar3 = zVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) goto LAB_00180394;
    }
    else {
      zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
      if (this->debugTraceEnabled != true) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      std::operator+(&local_2b8,"init driver ",&driver->name);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_2d8 = &local_2c8;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_2c8 = *plVar10;
        lStack_2c0 = plVar8[3];
      }
      else {
        local_2c8 = *plVar10;
        local_2d8 = (long *)*plVar8;
      }
      lVar4 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_2d8,lVar4 + (long)local_2d8);
      to_string_abi_cxx11_(&local_70,(loader *)(ulong)uVar5,result);
      debug_trace_message(this,&local_170,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_1b0.field_2._M_allocated_capacity = local_170.field_2._M_allocated_capacity;
      _Var14._M_p = local_170._M_dataplus._M_p;
      zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
LAB_00180394:
        zVar6 = zVar3;
        operator_delete(_Var14._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_2d8 == &local_2c8) {
      return zVar6;
    }
LAB_001803a9:
    operator_delete(local_2d8,local_2c8 + 1);
  }
  else {
    if (desc == (ze_init_driver_type_desc_t *)0x0) {
      if (((driver->dditable).ze.Global.pfnInit != (ze_pfnInit_t)0x0) &&
         (globalInitStored->pfnInit != (ze_pfnInit_t)0x0)) {
        zVar6 = (*globalInitStored->pfnInit)(flags);
        zVar3 = driver->initStatus;
        if (zVar6 == ZE_RESULT_SUCCESS && zVar3 == ZE_RESULT_SUCCESS) {
          return ZE_RESULT_SUCCESS;
        }
        if (zVar3 != ZE_RESULT_SUCCESS) {
          zVar6 = zVar3;
        }
        if (this->debugTraceEnabled != true) {
          return zVar6;
        }
        std::operator+(&local_258,"init driver (global ddi) ",&driver->name);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_258);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_298.field_2._M_allocated_capacity = *psVar11;
          local_298.field_2._8_8_ = plVar8[3];
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        }
        else {
          local_298.field_2._M_allocated_capacity = *psVar11;
          local_298._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_298._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        to_string_abi_cxx11_
                  (&local_278,(loader *)(ulong)flags,(ze_init_flags_t)local_298._M_string_length);
        std::operator+(&local_2b8,&local_298,&local_278);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b8);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_2c8 = *plVar10;
          lStack_2c0 = plVar8[3];
          local_2d8 = &local_2c8;
        }
        else {
          local_2c8 = *plVar10;
          local_2d8 = (long *)*plVar8;
        }
        lVar4 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,local_2d8,lVar4 + (long)local_2d8);
        to_string_abi_cxx11_(&local_f0,(loader *)(ulong)zVar6,result_06);
        debug_trace_message(this,&local_1f0,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if (local_2d8 == &local_2c8) {
          return zVar6;
        }
        operator_delete(local_2d8,local_2c8 + 1);
        return zVar6;
      }
      if (this->debugTraceEnabled != true) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      std::operator+(&local_2b8,"init driver ",&driver->name);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
      local_2d8 = &local_2c8;
      plVar8 = puVar9 + 2;
      if ((long *)*puVar9 == plVar8) {
        local_2c8 = *plVar8;
        lStack_2c0 = puVar9[3];
      }
      else {
        local_2c8 = *plVar8;
        local_2d8 = (long *)*puVar9;
      }
      lVar4 = puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,local_2d8,lVar4 + (long)local_2d8);
      to_string_abi_cxx11_(&local_d0,(loader *)0x78000001,result_02);
      debug_trace_message(this,&local_1d0,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      _Var14._M_p = local_1d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
LAB_0018047d:
        operator_delete(_Var14._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (((driver->dditable).ze.Global.pfnInitDrivers != (ze_pfnInitDrivers_t)0x0) &&
         (globalInitStored->pfnInitDrivers != (ze_pfnInitDrivers_t)0x0)) {
        local_238 = 0;
        zVar6 = (*globalInitStored->pfnInitDrivers)(&local_238,(ze_driver_handle_t *)0x0,desc);
        zVar3 = driver->initDriversStatus;
        if (zVar6 == ZE_RESULT_SUCCESS && zVar3 == ZE_RESULT_SUCCESS) {
          return ZE_RESULT_SUCCESS;
        }
        if (zVar3 != ZE_RESULT_SUCCESS) {
          zVar6 = zVar3;
        }
        if (this->debugTraceEnabled != true) {
          return zVar6;
        }
        std::operator+(&local_258,"init driver (global ddi) ",&driver->name);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_258);
        paVar2 = &local_298.field_2;
        puVar12 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_298.field_2._M_allocated_capacity = *puVar12;
          local_298.field_2._8_8_ = plVar8[3];
          local_298._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_298.field_2._M_allocated_capacity = *puVar12;
          local_298._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_298._M_string_length = plVar8[1];
        *plVar8 = (long)puVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        to_string_abi_cxx11_
                  (&local_278,(loader *)desc,
                   (ze_init_driver_type_desc_t *)local_298._M_string_length);
        uVar1 = (long)(ze_structure_type_t *)local_298._M_string_length + local_278._M_string_length
        ;
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != paVar2) {
          uVar13 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < uVar1) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            uVar13 = local_278.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < uVar1) goto LAB_001801ea;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_278,0,(char *)0x0,(ulong)local_298._M_dataplus._M_p);
        }
        else {
LAB_001801ea:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_298,(ulong)local_278._M_dataplus._M_p);
        }
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        psVar11 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2b8.field_2._M_allocated_capacity = *psVar11;
          local_2b8.field_2._8_8_ = puVar9[3];
        }
        else {
          local_2b8.field_2._M_allocated_capacity = *psVar11;
          local_2b8._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_2b8._M_string_length = puVar9[1];
        *puVar9 = psVar11;
        puVar9[1] = 0;
        *(undefined1 *)psVar11 = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
        plVar8 = puVar9 + 2;
        if ((long *)*puVar9 == plVar8) {
          local_2c8 = *plVar8;
          lStack_2c0 = puVar9[3];
          local_2d8 = &local_2c8;
        }
        else {
          local_2c8 = *plVar8;
          local_2d8 = (long *)*puVar9;
        }
        lVar4 = puVar9[1];
        *puVar9 = plVar8;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != paVar2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,local_2d8,lVar4 + (long)local_2d8);
        to_string_abi_cxx11_(&local_130,(loader *)(ulong)zVar6,result_05);
        debug_trace_message(this,&local_230,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if (local_2d8 == &local_2c8) {
          return zVar6;
        }
        goto LAB_001803a9;
      }
      if (this->debugTraceEnabled != true) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      std::operator+(&local_2b8,"init driver ",&driver->name);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_2d8 = &local_2c8;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_2c8 = *plVar10;
        lStack_2c0 = plVar8[3];
      }
      else {
        local_2c8 = *plVar10;
        local_2d8 = (long *)*plVar8;
      }
      lVar4 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,local_2d8,lVar4 + (long)local_2d8);
      to_string_abi_cxx11_(&local_110,(loader *)0x78000001,result_00);
      debug_trace_message(this,&local_210,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      local_1d0.field_2._M_allocated_capacity = local_210.field_2._M_allocated_capacity;
      _Var14._M_p = local_210._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_0018047d;
    }
LAB_00180485:
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return zVar6;
}

Assistant:

ze_result_t context_t::init_driver(driver_t &driver, ze_init_flags_t flags, ze_init_driver_type_desc_t* desc, ze_global_dditable_t *globalInitStored, zes_global_dditable_t *sysmanGlobalInitStored, bool sysmanOnly) {
        if (sysmanOnly) {
            auto getTable = reinterpret_cast<zes_pfnGetGlobalProcAddrTable_t>(
                GET_FUNCTION_PTR(driver.handle, "zesGetGlobalProcAddrTable"));
            if(!getTable) {
                if (debugTraceEnabled) {
                    std::string errorMessage = "init driver " + driver.name + " failed, zesGetGlobalProcAddrTable function pointer null. Returning ";
                    debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                }
                return ZE_RESULT_ERROR_UNINITIALIZED;
            }

            zes_global_dditable_t global;
            auto getTableResult = getTable(ZE_API_VERSION_CURRENT, &global);
            if(getTableResult != ZE_RESULT_SUCCESS) {
                if (debugTraceEnabled) {
                    std::string errorMessage = "init driver " + driver.name + " failed, zesGetGlobalProcAddrTable() failed with ";
                    debug_trace_message(errorMessage, loader::to_string(getTableResult));
                }
                return ZE_RESULT_ERROR_UNINITIALIZED;
            }

            if(nullptr == global.pfnInit) {
                if (debugTraceEnabled) {
                    std::string errorMessage = "init driver " + driver.name + " failed, zesInit function pointer null. Returning ";
                    debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                }
                return ZE_RESULT_ERROR_UNINITIALIZED;
            }

            // Use the previously init ddi table pointer to zesInit to allow for intercept of the zesInit calls
            ze_result_t res = sysmanGlobalInitStored->pfnInit(flags);
            // Verify that this driver successfully init in the call above.
            if (driver.initSysManStatus != ZE_RESULT_SUCCESS) {
                res = driver.initSysManStatus;
            }
            if (debugTraceEnabled) {
                std::string message = "init driver " + driver.name + " zesInit(" + loader::to_string(flags) + ") returning ";
                debug_trace_message(message, loader::to_string(res));
            }
            return res;
        } else {
            if (!desc) {
                auto pfnInit = driver.dditable.ze.Global.pfnInit;
                if(nullptr == pfnInit || globalInitStored->pfnInit == nullptr) {
                    if (debugTraceEnabled) {
                        std::string errorMessage = "init driver " + driver.name + " failed, zeInit function pointer null. Returning ";
                        debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                    }
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }

                // Use the previously init ddi table pointer to zeInit to allow for intercept of the zeInit calls
                ze_result_t res = globalInitStored->pfnInit(flags);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS || driver.initStatus != ZE_RESULT_SUCCESS) {
                    if (driver.initStatus != ZE_RESULT_SUCCESS)
                        res = driver.initStatus;
                    if (debugTraceEnabled) {
                        std::string message = "init driver (global ddi) " + driver.name + " zeInit(" + loader::to_string(flags) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    return res;
                }
            } else {
                auto pfnInitDrivers = driver.dditable.ze.Global.pfnInitDrivers;
                if(nullptr == pfnInitDrivers || globalInitStored->pfnInitDrivers == nullptr) {
                    if (debugTraceEnabled) {
                        std::string errorMessage = "init driver " + driver.name + " failed, pfnInitDrivers function pointer null. Returning ";
                        debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                    }
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }

                uint32_t pCount = 0;
                // Use the previously init ddi table pointer to zeInitDrivers to allow for intercept of the zeInitDrivers calls
                ze_result_t res = globalInitStored->pfnInitDrivers(&pCount, nullptr, desc);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS || driver.initDriversStatus != ZE_RESULT_SUCCESS) {
                    if (driver.initDriversStatus != ZE_RESULT_SUCCESS)
                        res = driver.initDriversStatus;
                    if (debugTraceEnabled) {
                        std::string message = "init driver (global ddi) " + driver.name + " zeInitDrivers(" + loader::to_string(desc) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    return res;
                }
            }
            return ZE_RESULT_SUCCESS;
        }
    }